

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentErrorsTest::ExpectError
          (RenderbufferAttachmentErrorsTest *this,GLenum expected_error,bool framebuffer,
          bool attachment,bool color_attachment,bool renderbuffertarget,bool renderbuffer)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  char *pcVar5;
  bool *pbVar6;
  char *pcVar7;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"NamedFramebufferRenderbuffer called with ",0x29);
    pcVar7 = "invalid";
    pcVar5 = "invalid";
    if (framebuffer) {
      pcVar5 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar5,(ulong)!framebuffer * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," framebuffer, ",0xe);
    pcVar5 = "invalid";
    if (attachment) {
      pcVar5 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar5,(ulong)!attachment * 2 + 5);
    pbVar6 = glcts::fixed_sample_locations_values + 1;
    if (color_attachment) {
      pbVar6 = (bool *)0x1b82907;
    }
    lVar4 = 6;
    if (!color_attachment) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar6,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," attachment, ",0xd);
    pcVar5 = "invalid";
    if (renderbuffertarget) {
      pcVar5 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar5,(ulong)!renderbuffertarget * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," renderbuffer target, ",0x16);
    if (renderbuffer) {
      pcVar7 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar7,(ulong)!renderbuffer * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," renderbuffer was expected to generate ",0x27);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", but ",6);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," was observed instead.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  do {
    iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar3 != 0);
  return GVar2 == expected_error;
}

Assistant:

bool RenderbufferAttachmentErrorsTest::ExpectError(glw::GLenum expected_error, bool framebuffer, bool attachment,
												   bool color_attachment, bool renderbuffertarget, bool renderbuffer)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "NamedFramebufferRenderbuffer called with "
			<< (framebuffer ? "valid" : "invalid") << " framebuffer, " << (attachment ? "valid" : "invalid")
			<< (color_attachment ? " color" : "") << " attachment, " << (renderbuffertarget ? "valid" : "invalid")
			<< " renderbuffer target, " << (renderbuffer ? "valid" : "invalid")
			<< " renderbuffer was expected to generate " << glu::getErrorStr(expected_error) << ", but "
			<< glu::getErrorStr(error) << " was observed instead." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}